

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O0

void __thiscall
Imf_3_4::Array2D<Imf_3_4::Rgba>::resizeErase(Array2D<Imf_3_4::Rgba> *this,long sizeX,long sizeY)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Rgba *pRVar4;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  Rgba *tmp;
  Rgba *local_58;
  
  uVar2 = in_RSI * in_RDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pRVar4 = (Rgba *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_58 = pRVar4;
    do {
      Rgba::Rgba(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != pRVar4 + uVar2);
  }
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = (long)pRVar4;
  return;
}

Assistant:

inline void
Array2D<T>::resizeErase (long sizeX, long sizeY)
{
    T* tmp = new T[sizeX * sizeY];
    delete[] _data;
    _sizeX = sizeX;
    _sizeY = sizeY;
    _data  = tmp;
}